

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O3

void __thiscall iu_Optional_x_iutest_x_Compare_Test::Body(iu_Optional_x_iutest_x_Compare_Test *this)

{
  char *pcVar1;
  TestPartResultReporterInterface *pTVar2;
  TestFlag *pTVar3;
  Variable *pVVar4;
  optional<int> *in_R9;
  ScopedSPITestFlag guard;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  optional<int> opt_1;
  allocator<char> local_25d;
  TestFlag local_25c;
  undefined1 local_258 [32];
  char *local_238;
  undefined8 local_230;
  SPIFailureChecker local_228;
  AssertionResult local_1f0;
  AssertionResult local_1c8;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  local_1c8.m_message._M_dataplus._M_p._0_4_ = 0;
  local_1c8.m_message._M_dataplus._M_p._4_4_ =
       CONCAT31(local_1c8.m_message._M_dataplus._M_p._5_3_,1);
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            ((AssertionResult *)local_258,(internal *)0x13e38d,"opt",local_1a0,(int *)&local_1c8,
             in_R9);
  if (local_238._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,(char *)local_258._0_8_,(allocator<char> *)&local_1f0);
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13e1be;
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000053;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_228,(Fixed *)local_1a0,false);
    if (local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_228.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  pcVar1 = local_258 + 0x10;
  if ((char *)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  local_1c8.m_message._M_dataplus._M_p._4_4_ =
       local_1c8.m_message._M_dataplus._M_p._4_4_ & 0xffffff00;
  iutest::internal::CmpHelperEQ<std::nullopt_t,std::optional<int>>
            ((AssertionResult *)local_258,(internal *)"::std::nullopt","opt","",
             (nullopt_t *)&local_1c8,in_R9);
  if (local_238._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,(char *)local_258._0_8_,(allocator<char> *)&local_1f0);
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13e1be;
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000057;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_228,(Fixed *)local_1a0,false);
    if (local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_228.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((char *)local_258._0_8_ != pcVar1) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_228.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0014e2d0;
  local_228.m_Type = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_25c);
  local_1a0._0_4_ = 0x4d2;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            (&local_1c8,(internal *)"1234","opt",local_1a0,(int *)&Body::opt,in_R9);
  if (local_1c8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_258,
               (char *)CONCAT44(local_1c8.m_message._M_dataplus._M_p._4_4_,
                                local_1c8.m_message._M_dataplus._M_p._0_4_),&local_25d);
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_230._0_4_ = 0x5c;
    local_230._4_4_ = 1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_258,(Fixed *)local_1a0,false);
    if ((char *)local_258._0_8_ != pcVar1) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1c8.m_message._M_dataplus._M_p._4_4_,
                  local_1c8.m_message._M_dataplus._M_p._0_4_) != &local_1c8.m_message.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1c8.m_message._M_dataplus._M_p._4_4_,
                             local_1c8.m_message._M_dataplus._M_p._0_4_),
                    local_1c8.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = local_25c.m_test_flags;
  local_1a0._16_4_ = 0x34333231;
  local_1a0._8_8_ = 4;
  local_1a0._20_4_ = local_1a0._20_4_ & 0xffffff00;
  local_1a0._0_8_ = local_1a0 + 0x10;
  iutest::detail::SPIFailureChecker::GetResult(&local_1f0,&local_228,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,CONCAT44(local_1a0._20_4_,local_1a0._16_4_) + 1);
  }
  local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0014e350;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar2 = local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0014e378;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = pTVar2;
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,local_1f0.m_message._M_dataplus._M_p,
               (allocator<char> *)local_258);
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13e1be;
    local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x10000005c;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_228,(Fixed *)local_1a0,false);
    if (local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_228.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_228.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Optional, Compare)
{
    {
        ::std::optional<int> opt = 0;
        IUTEST_EXPECT_TRUE(opt);
        IUTEST_EXPECT_EQ(0, opt);
    }
    {
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_EQ(::std::nullopt, opt);
    }
    {
        static const ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_FALSE(opt);
        IUTEST_EXPECT_NONFATAL_FAILURE(IUTEST_EXPECT_EQ(1234, opt), "1234");
    }
}